

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

ssize_t __thiscall
zmq::stream_engine_base_t::read(stream_engine_base_t *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int *piVar2;
  int rc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = tcp_read(rc,(void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (size_t)this);
  if (uVar1 == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x20;
    uVar1 = 0xffffffff;
  }
  return (ulong)uVar1;
}

Assistant:

int zmq::stream_engine_base_t::read (void *data_, size_t size_)
{
    const int rc = zmq::tcp_read (_s, data_, size_);

    if (rc == 0) {
        // connection closed by peer
        errno = EPIPE;
        return -1;
    }

    return rc;
}